

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_half(secp256k1_scalar *r,secp256k1_scalar *a)

{
  uint64_t uVar1;
  secp256k1_scalar *in_RSI;
  uint64_t *in_RDI;
  secp256k1_uint128 t;
  uint64_t mask;
  secp256k1_uint128 sStack_28;
  ulong local_18;
  secp256k1_scalar *local_10;
  uint64_t *local_8;
  
  local_18 = -(in_RSI->d[0] & 1);
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_scalar_verify(in_RSI);
  secp256k1_u128_from_u64(&sStack_28,local_10->d[0] >> 1 | local_10->d[1] << 0x3f);
  secp256k1_u128_accum_u64(&sStack_28,local_18 & 0xdfe92f46681b20a1);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  *local_8 = uVar1;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_10->d[1] >> 1 | local_10->d[2] << 0x3f);
  secp256k1_u128_accum_u64(&sStack_28,local_18 & 0x5d576e7357a4501d);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  local_8[1] = uVar1;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_10->d[2] >> 1 | local_10->d[3] << 0x3f);
  secp256k1_u128_accum_u64(&sStack_28,local_18);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  local_8[2] = uVar1;
  secp256k1_u128_rshift(&sStack_28,0x40);
  uVar1 = secp256k1_u128_to_u64(&sStack_28);
  local_8[3] = uVar1 + (local_10->d[3] >> 1) + (local_18 & 0x7fffffffffffffff);
  return;
}

Assistant:

static void secp256k1_scalar_half(secp256k1_scalar *r, const secp256k1_scalar *a) {
    /* Writing `/` for field division and `//` for integer division, we compute
     *
     *   a/2 = (a - (a&1))/2 + (a&1)/2
     *       = (a >> 1) + (a&1 ?    1/2 : 0)
     *       = (a >> 1) + (a&1 ? n//2+1 : 0),
     *
     * where n is the group order and in the last equality we have used 1/2 = n//2+1 (mod n).
     * For n//2, we have the constants SECP256K1_N_H_0, ...
     *
     * This sum does not overflow. The most extreme case is a = -2, the largest odd scalar. Here:
     * - the left summand is:  a >> 1 = (a - a&1)/2 = (n-2-1)//2           = (n-3)//2
     * - the right summand is: a&1 ? n//2+1 : 0 = n//2+1 = (n-1)//2 + 2//2 = (n+1)//2
     * Together they sum to (n-3)//2 + (n+1)//2 = (2n-2)//2 = n - 1, which is less than n.
     */
    uint64_t mask = -(uint64_t)(a->d[0] & 1U);
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_u128_from_u64(&t, (a->d[0] >> 1) | (a->d[1] << 63));
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_H_0 + 1U) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, (a->d[1] >> 1) | (a->d[2] << 63));
    secp256k1_u128_accum_u64(&t, SECP256K1_N_H_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, (a->d[2] >> 1) | (a->d[3] << 63));
    secp256k1_u128_accum_u64(&t, SECP256K1_N_H_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    r->d[3] = secp256k1_u128_to_u64(&t) + (a->d[3] >> 1) + (SECP256K1_N_H_3 & mask);
#ifdef VERIFY
    /* The line above only computed the bottom 64 bits of r->d[3]; redo the computation
     * in full 128 bits to make sure the top 64 bits are indeed zero. */
    secp256k1_u128_accum_u64(&t, a->d[3] >> 1);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_H_3 & mask);
    secp256k1_u128_rshift(&t, 64);
    VERIFY_CHECK(secp256k1_u128_to_u64(&t) == 0);

    SECP256K1_SCALAR_VERIFY(r);
#endif
}